

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildDeclarationList(CNscPStackEntry *pList,CNscPStackEntry *pDeclaration)

{
  NscType NVar1;
  CNscPStackEntry *in_RSI;
  CNscPStackEntry *in_RDI;
  CNscPStackEntry *pOut;
  CNscPStackEntry *in_stack_ffffffffffffffd8;
  CNscContext *in_stack_ffffffffffffffe0;
  CNscPStackEntry *pauchData;
  
  if (in_RDI == (CNscPStackEntry *)0x0) {
    in_RDI = CNscContext::GetPStackEntry
                       (in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,0);
    CNscPStackEntry::SetType
              ((CNscPStackEntry *)in_stack_ffffffffffffffe0,
               (NscType)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  }
  NVar1 = CNscPStackEntry::GetType(in_RDI);
  if ((NVar1 != NscType_Error) && (in_RSI != (CNscPStackEntry *)0x0)) {
    NVar1 = CNscPStackEntry::GetType(in_RSI);
    if (NVar1 == NscType_Error) {
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)in_stack_ffffffffffffffe0,
                 (NscType)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    }
    else {
      pauchData = in_RDI;
      in_stack_ffffffffffffffe0 = (CNscContext *)CNscPStackEntry::GetData(in_RSI);
      CNscPStackEntry::GetDataSize(in_RSI);
      CNscPStackEntry::AppendData(in_RSI,pauchData,(size_t)in_stack_ffffffffffffffe0);
      in_stack_ffffffffffffffd8 = in_RDI;
      in_RDI = pauchData;
    }
  }
  if (in_RSI != (CNscPStackEntry *)0x0) {
    CNscContext::FreePStackEntry(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  return in_RDI;
}

Assistant:

YYSTYPE NscBuildDeclarationList (YYSTYPE pList, YYSTYPE pDeclaration)
{
	CNscPStackEntry *pOut = pList;

	//
	// If there isn't an list, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// Process the declaration
	//

	if (pOut ->GetType () != NscType_Error)
	{
		if (pDeclaration)
		{
			if (pDeclaration ->GetType () != NscType_Error)
			{
				pOut ->AppendData (pDeclaration ->GetData (),
					pDeclaration ->GetDataSize ());
			}
			else
				pOut ->SetType (NscType_Error);
		}
	}
	if (pDeclaration)
	    g_pCtx ->FreePStackEntry (pDeclaration);

	//
	// Return the new expression
	//

	return pOut;
}